

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

EventTriggerStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EventTriggerStatementSyntax,slang::syntax::EventTriggerStatementSyntax_const&>
          (BumpAllocator *this,EventTriggerStatementSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  TimingControlSyntax *pTVar4;
  NameSyntax *pNVar5;
  Info *pIVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  EventTriggerStatementSyntax *pEVar15;
  
  pEVar15 = (EventTriggerStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EventTriggerStatementSyntax *)this->endPtr < pEVar15 + 1) {
    pEVar15 = (EventTriggerStatementSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(pEVar15 + 1);
  }
  (pEVar15->super_StatementSyntax).super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).super_SyntaxNode.previewNode;
  uVar7 = *(undefined4 *)&(args->super_StatementSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_StatementSyntax).super_SyntaxNode.parent;
  (pEVar15->super_StatementSyntax).super_SyntaxNode.kind =
       (args->super_StatementSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar15->super_StatementSyntax).super_SyntaxNode.field_0x4 = uVar7;
  (pEVar15->super_StatementSyntax).super_SyntaxNode.parent = pSVar1;
  (pEVar15->super_StatementSyntax).label = (args->super_StatementSyntax).label;
  (pEVar15->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar7 = *(undefined4 *)
           &(args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pEVar15->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pEVar15->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar7;
  (pEVar15->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pEVar15->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005e5cf8;
  (pEVar15->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_StatementSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pEVar15->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_StatementSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pEVar15->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pEVar15->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005e5c48;
  uVar8 = (args->trigger).field_0x2;
  NVar9.raw = (args->trigger).numFlags.raw;
  uVar10 = (args->trigger).rawLen;
  pIVar3 = (args->trigger).info;
  pTVar4 = args->timing;
  pNVar5 = (args->name).ptr;
  TVar11 = (args->semi).kind;
  uVar12 = (args->semi).field_0x2;
  NVar13.raw = (args->semi).numFlags.raw;
  uVar14 = (args->semi).rawLen;
  pIVar6 = (args->semi).info;
  (pEVar15->trigger).kind = (args->trigger).kind;
  (pEVar15->trigger).field_0x2 = uVar8;
  (pEVar15->trigger).numFlags = (NumericTokenFlags)NVar9.raw;
  (pEVar15->trigger).rawLen = uVar10;
  (pEVar15->trigger).info = pIVar3;
  pEVar15->timing = pTVar4;
  (pEVar15->name).ptr = pNVar5;
  (pEVar15->semi).kind = TVar11;
  (pEVar15->semi).field_0x2 = uVar12;
  (pEVar15->semi).numFlags = (NumericTokenFlags)NVar13.raw;
  (pEVar15->semi).rawLen = uVar14;
  (pEVar15->semi).info = pIVar6;
  return pEVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }